

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

_Bool do_cmd_open_aux(loc_conflict grid)

{
  player *p;
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t chance;
  _Bool more;
  loc_conflict grid_local;
  
  grid_local.x._3_1_ = false;
  _Var1 = do_cmd_open_test(player,grid);
  if (_Var1) {
    _Var1 = square_islockeddoor((chunk *)cave,grid);
    p = player;
    if (_Var1) {
      wVar2 = square_door_power((chunk_conflict2 *)cave,grid);
      _Var1 = no_light(player);
      wVar2 = calc_unlocking_chance(p,wVar2,_Var1);
      wVar3 = Rand_div(100);
      grid_local.x._3_1_ = wVar2 <= wVar3;
      if (grid_local.x._3_1_) {
        event_signal(EVENT_INPUT_FLUSH);
        msgt(0x1c,"You failed to pick the lock.");
      }
      else {
        msgt(0x57,"You have picked the lock.");
        square_open_door((chunk *)cave,grid);
        square_memorize((chunk *)cave,grid);
        square_light_spot((chunk *)cave,(loc)grid);
        player->upkeep->update = player->upkeep->update | 0x60;
      }
    }
    else {
      square_open_door((chunk *)cave,grid);
      square_memorize((chunk *)cave,grid);
      square_light_spot((chunk *)cave,(loc)grid);
      player->upkeep->update = player->upkeep->update | 0x60;
      sound(0x17);
    }
  }
  else {
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool do_cmd_open_aux(struct loc grid)
{
	bool more = false;

	/* Verify legality */
	if (!do_cmd_open_test(player, grid)) return (false);

	/* Locked door */
	if (square_islockeddoor(cave, grid)) {
		int chance = calc_unlocking_chance(player,
			square_door_power(cave, grid), no_light(player));

		if (randint0(100) < chance) {
			/* Message */
			msgt(MSG_LOCKPICK, "You have picked the lock.");

			/* Open the door */
			square_open_door(cave, grid);

			/* Update the visuals */
			square_memorize(cave, grid);
			square_light_spot(cave, grid);
			player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

			/* Experience */
			/* Removed to avoid exploit by repeatedly locking and unlocking */
			/* player_exp_gain(player, 1); */
		} else {
			event_signal(EVENT_INPUT_FLUSH);

			/* Message */
			msgt(MSG_LOCKPICK_FAIL, "You failed to pick the lock.");

			/* We may keep trying */
			more = true;
		}
	} else {
		/* Closed door */
		square_open_door(cave, grid);
		square_memorize(cave, grid);
		square_light_spot(cave, grid);
		player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
		sound(MSG_OPENDOOR);
	}

	/* Result */
	return (more);
}